

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ComputeValidJointActionExtensions
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *valid_JAs)

{
  int *piVar1;
  uint uVar2;
  Index jt_bgI;
  pointer puVar3;
  sp_counted_base *psVar4;
  BGIP_BnB_NodePtr local_48;
  element_type *local_30;
  shared_count local_28;
  
  puVar3 = (valid_JAs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((valid_JAs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (valid_JAs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  local_30 = node->px;
  uVar2 = *(uint *)(local_30 + 0x20);
  local_28.pi_ = (node->pn).pi_;
  if (local_28.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_28.pi_)->use_count_ = (local_28.pi_)->use_count_ + 1;
    UNLOCK();
  }
  jt_bgI = (this->_m_jtIndexMapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar2];
  boost::detail::shared_count::~shared_count(&local_28);
  psVar4 = (node->pn).pi_;
  local_48.px = node->px;
  local_48.pn.pi_ = (node->pn).pi_;
  if (psVar4 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar4->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  ComputeValidJointActions(this,jt_bgI,valid_JAs,&local_48);
  boost::detail::shared_count::~shared_count(&local_48.pn);
  return;
}

Assistant:

void 
    ComputeValidJointActionExtensions(BGIP_BnB_NodePtr node, 
                                      std::vector<Index>& valid_JAs){
    // a std::vector containing all valid joint actions
    //std::vector<Index> valid_JAs;
    valid_JAs.clear();
    // the joint type we are currently considering
    // *node* specifies jt_oI =  node->GetDepth() - 1
    // so its child specifies jt_oI =  node->GetDepth()
    Index jt_oI = node->GetDepth();
    Index jt_bgI=GetJTIndexMapping(jt_oI, node);

#if DEBUG_VALID_ACTIONS            
    std::cout << "\tComputing valid JAs for the "<<jt_oI<<"th joint type, corr. to jt_bgI"<<jt_bgI<<std::endl;
#endif
    ComputeValidJointActions(jt_bgI, valid_JAs, node);
#if CHECK_VALID_JA        
    std::vector<Index> control_JAs;
    ComputeValidJointActionsOld(node, jt_bgI, control_JAs);
    std::sort( valid_JAs.begin(), valid_JAs.end());
    std::sort( control_JAs.begin(), control_JAs.end());
    if(! VectorTools::Equal(valid_JAs, control_JAs) )
    {
        std::cout <<"BGIP_SolverBranchAndBound WARNING!!! valid joint actions not equal!!!"<<std::endl
                  << "valid_JAs="<< SoftPrintVector(valid_JAs) << std::endl
                  << "control_JAs="<< SoftPrintVector(control_JAs) << std::endl;
    }
    else
        std::cout << "BGIP_SolverBranchAndBound Valid joint actions equal: "<< 
            SoftPrintVector(valid_JAs) << std::endl;
#endif
    
}